

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

QList<int> * __thiscall
QDockAreaLayoutInfo::gapIndex
          (QList<int> *__return_storage_ptr__,QDockAreaLayoutInfo *this,QPoint *_pos,
          bool nestingEnabled,TabMode tabMode)

{
  Orientation OVar1;
  QDockAreaLayoutItem *pQVar2;
  long lVar3;
  Data *pDVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  QPoint *pQVar8;
  QList<int> *pQVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  Representation RVar15;
  int iVar16;
  ulong uVar17;
  long in_FS_OFFSET;
  bool bVar18;
  QRect QVar19;
  QPoint pos;
  undefined1 local_58 [8];
  int iStack_50;
  int iStack_4c;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (this->tabbed == true) {
    QVar19 = tabContentRect(this);
  }
  else {
    pQVar8 = (QPoint *)&_pos->yp;
    if (this->o == Horizontal) {
      pQVar8 = _pos;
    }
    if ((this->item_list).d.size == 0) {
      bVar18 = true;
      QVar19 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
      RVar15.m_i = 0;
      bVar6 = false;
    }
    else {
      iVar10 = (pQVar8->xp).m_i;
      uVar17 = 0xffffffff;
      lVar12 = 0;
      uVar11 = 0;
      bVar6 = false;
      QVar19 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
      do {
        pQVar2 = (this->item_list).d.ptr;
        bVar5 = QDockAreaLayoutItem::skip
                          ((QDockAreaLayoutItem *)((long)&pQVar2->widgetItem + lVar12));
        iVar13 = 4;
        bVar18 = true;
        if (!bVar5) {
          iVar13 = 4;
          if (iVar10 <= *(int *)((long)&pQVar2->size + lVar12) +
                        *(int *)((long)&pQVar2->pos + lVar12)) {
            lVar3 = *(long *)((long)&pQVar2->subinfo + lVar12);
            if ((lVar3 == 0) || (*(char *)(lVar3 + 0x58) != '\0')) {
              bVar18 = false;
              QVar19 = itemRect(this,(int)uVar11,false);
              iVar13 = 2;
              uVar17 = uVar11 & 0xffffffff;
              goto LAB_003f681e;
            }
            gapIndex((QList<int> *)local_58,
                     *(QDockAreaLayoutInfo **)((long)&pQVar2->subinfo + lVar12),_pos,nestingEnabled,
                     tabMode);
            QArrayDataPointer<int>::operator=
                      (&__return_storage_ptr__->d,(QArrayDataPointer<int> *)local_58);
            if ((QPoint)local_58 != (QPoint)0x0) {
              LOCK();
              *(int *)local_58 = *(int *)local_58 + -1;
              UNLOCK();
              if (*(int *)local_58 == 0) {
                QArrayData::deallocate((QArrayData *)local_58,4,0x10);
              }
            }
            local_58._0_4_ = (int)uVar11;
            bVar18 = false;
            QtPrivate::QPodArrayOps<int>::emplace<int&>
                      ((QPodArrayOps<int> *)__return_storage_ptr__,0,(int *)local_58);
            bVar6 = true;
            iVar13 = 1;
          }
          uVar17 = uVar11 & 0xffffffff;
        }
LAB_003f681e:
        if (!bVar18) goto LAB_003f6839;
        uVar11 = uVar11 + 1;
        lVar12 = lVar12 + 0x28;
      } while (uVar11 < (ulong)(this->item_list).d.size);
      iVar13 = 2;
LAB_003f6839:
      bVar18 = iVar13 == 2;
      RVar15.m_i = (int)uVar17 + 1;
    }
    if (bVar18) {
      bVar18 = true;
      if ((QVar19.x1.m_i.m_i + -1 == QVar19.x2.m_i.m_i) &&
         (QVar19.y1.m_i.m_i + -1 == QVar19.y2.m_i.m_i)) {
        local_58._0_4_ = RVar15.m_i;
        QtPrivate::QPodArrayOps<int>::emplace<int&>
                  ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
                   (int *)local_58);
        QList<int>::end(__return_storage_ptr__);
        bVar6 = true;
        goto LAB_003f68c6;
      }
    }
    else {
LAB_003f68c6:
      bVar18 = false;
    }
    if (!bVar18) {
      if ((!bVar6) && (pDVar4 = (__return_storage_ptr__->d).d, pDVar4 != (Data *)0x0)) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&((__return_storage_ptr__->d).d)->super_QArrayData,4,0x10);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return __return_storage_ptr__;
    }
  }
  uVar11 = 4;
  if (tabMode == ForceTabs) goto LAB_003f68ea;
  OVar1 = this->o;
  iVar13 = (_pos->xp).m_i - QVar19.x1.m_i;
  iVar10 = (_pos->yp).m_i - QVar19.y1.m_i;
  local_40 = CONCAT44(iVar10,iVar13);
  iVar14 = (QVar19.x2.m_i.m_i - QVar19.x1.m_i) + 1;
  iVar16 = (QVar19.y2.m_i.m_i - QVar19.y1.m_i) + 1;
  if (tabMode != NoTabs) {
    if (nestingEnabled) {
      local_58._4_4_ = iVar16 / 6;
      local_58._0_4_ = iVar14 / 6;
      _iStack_50 = (int *)CONCAT44(iVar16 / 6 + (iVar16 * 2) / 3 + -1,
                                   iVar14 / 6 + -1 + (iVar14 * 2) / 3);
      cVar7 = QRect::contains((QPoint *)local_58,SUB81(&local_40,0));
      uVar11 = 4;
      if (cVar7 != '\0') goto LAB_003f68ea;
    }
    else if (OVar1 == Horizontal) {
      if ((iVar14 / 6 < iVar13) && (uVar11 = 4, iVar13 < (iVar14 * 5) / 6)) goto LAB_003f68ea;
    }
    else if ((iVar16 / 6 < iVar10) && (uVar11 = 4, iVar10 < (iVar16 * 5) / 6)) goto LAB_003f68ea;
  }
  if (nestingEnabled) {
    if (OVar1 != Horizontal) {
      uVar11 = 2;
      if ((iVar10 < iVar16 / 3) || (uVar11 = 3, (iVar16 * 2) / 3 < iVar10)) goto LAB_003f68ea;
LAB_003f6c18:
      uVar11 = (ulong)(iVar14 / 2 <= iVar13);
      goto LAB_003f68ea;
    }
    uVar11 = 0;
    if ((iVar13 < iVar14 / 3) || (uVar11 = 1, (iVar14 * 2) / 3 < iVar13)) goto LAB_003f68ea;
  }
  else if (OVar1 == Horizontal) goto LAB_003f6c18;
  uVar11 = (ulong)(iVar10 < iVar16 / 2 ^ 3);
LAB_003f68ea:
  pQVar9 = (QList<int> *)(*(code *)((long)&DAT_006e3ee0 + (long)(int)(&DAT_006e3ee0)[uVar11]))();
  return pQVar9;
}

Assistant:

QList<int> QDockAreaLayoutInfo::gapIndex(const QPoint& _pos,
                        bool nestingEnabled, TabMode tabMode) const
{
    QList<int> result;
    QRect item_rect;
    int item_index = 0;

#if QT_CONFIG(tabbar)
    if (tabbed) {
        item_rect = tabContentRect();
    } else
#endif
    {
        int pos = pick(o, _pos);

        int last = -1;
        for (int i = 0; i < item_list.size(); ++i) {
            const QDockAreaLayoutItem &item = item_list.at(i);
            if (item.skip())
                continue;

            last = i;

            if (item.pos + item.size < pos)
                continue;

            if (item.subinfo != nullptr
#if QT_CONFIG(tabbar)
                && !item.subinfo->tabbed
#endif
                ) {
                result = item.subinfo->gapIndex(_pos, nestingEnabled,
                                                    tabMode);
                result.prepend(i);
                return result;
            }

            item_rect = itemRect(i);
            item_index = i;
            break;
        }

        if (item_rect.isNull()) {
            result.append(last + 1);
            return result;
        }
    }

    Q_ASSERT(!item_rect.isNull());

    QInternal::DockPosition dock_pos
        = dockPosHelper(item_rect, _pos, o, nestingEnabled, tabMode);

    switch (dock_pos) {
        case QInternal::LeftDock:
            if (o == Qt::Horizontal)
                result << item_index;
            else
                result << item_index << 0; // this subinfo doesn't exist yet, but insertGap()
                                           // handles this by inserting it
            break;
        case QInternal::RightDock:
            if (o == Qt::Horizontal)
                result << item_index + 1;
            else
                result << item_index << 1;
            break;
        case QInternal::TopDock:
            if (o == Qt::Horizontal)
                result << item_index << 0;
            else
                result << item_index;
            break;
        case QInternal::BottomDock:
            if (o == Qt::Horizontal)
                result << item_index << 1;
            else
                result << item_index + 1;
            break;
        case  QInternal::DockCount:
            result << (-item_index - 1) << 0;   // negative item_index means "on top of"
                                                // -item_index - 1, insertGap()
                                                // will insert a tabbed subinfo
            break;
        default:
            break;
    }

    return result;
}